

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_action(t_parser *this,size_t a_indent,t_node *a_target,bool a_assignable)

{
  undefined7 in_register_00000009;
  byte in_R8B;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> local_38;
  byte local_29;
  pointer ptStack_28;
  bool a_assignable_local;
  t_node *a_target_local;
  size_t a_indent_local;
  t_parser *this_local;
  
  ptStack_28 = (pointer)CONCAT71(in_register_00000009,a_assignable);
  local_29 = in_R8B & 1;
  a_target_local = a_target;
  a_indent_local = a_indent;
  this_local = this;
  std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>::
  unique_ptr<std::default_delete<xemmai::ast::t_node>,void>
            ((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)&local_38,
             ptStack_28);
  f_action(this,a_indent,
           (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)a_target,
           SUB81((unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>> *)
                 &local_38,0));
  std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
            (&local_38);
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> f_action(size_t a_indent, ast::t_node* a_target, bool a_assignable)
	{
		return f_action(a_indent, std::unique_ptr<ast::t_node>(a_target), a_assignable);
	}